

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O0

void __thiscall
SQCompilation::SQCompilationContext::vreportDiagnostic
          (SQCompilationContext *this,DiagnosticsId diagId,int32_t line,int32_t pos,int32_t width,
          __va_list_tag *vargs)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  SQMessageSeverity sev;
  SQCompilerMessage cm;
  SQ_COMPILER_DIAG_CB diagMsgFunc;
  char *msg;
  SQCOMPILERERROR messageFunc;
  char *extra;
  int32_t j_2;
  int32_t j_1;
  int32_t j;
  char *l3;
  char *l2;
  char *l1;
  string extraInfo;
  string message;
  bool isError;
  DiagnosticDescriptor *desc;
  bool doJump;
  __va_list_tag *in_stack_000006a0;
  string *in_stack_000006a8;
  DiagnosticsId in_stack_000006b4;
  string *in_stack_fffffffffffffe98;
  int32_t in_stack_fffffffffffffea0;
  int32_t in_stack_fffffffffffffea4;
  SQString *x;
  undefined8 in_stack_fffffffffffffeb0;
  int lineNo;
  SQSharedState *ss;
  SQCompilationContext *in_stack_fffffffffffffeb8;
  undefined4 local_10c;
  undefined4 local_108 [2];
  undefined8 local_100;
  int local_f8;
  int local_f4;
  undefined4 local_f0;
  SQSharedState *local_e8;
  undefined8 local_e0;
  byte local_d8;
  code *local_d0;
  SQSharedState *local_c8;
  code *local_c0;
  undefined8 local_b8;
  int local_ac;
  int local_a8;
  int local_a4;
  char *local_a0;
  char *local_98;
  char *local_90;
  string local_88 [48];
  string local_58 [39];
  byte local_31;
  undefined1 *local_30;
  byte local_21;
  undefined4 local_18;
  int local_14;
  int local_10;
  uint local_c;
  
  lineNo = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  local_21 = 0;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  bVar1 = isDisabled((SQCompilationContext *)messageFunc,msg._4_4_,(int)msg,diagMsgFunc._4_4_);
  if (!bVar1) {
    local_30 = diagnosticDescriptors + (ulong)local_c * 0x28;
    local_31 = 1 < *(int *)(diagnosticDescriptors + (ulong)local_c * 0x28 + 8);
    std::__cxx11::string::string(local_58);
    vrenderDiagnosticHeader(in_stack_000006b4,in_stack_000006a8,in_stack_000006a0);
    std::__cxx11::string::string(local_88);
    local_90 = findLine(in_stack_fffffffffffffeb8,lineNo);
    local_98 = findLine(in_stack_fffffffffffffeb8,lineNo);
    local_a0 = findLine(in_stack_fffffffffffffeb8,lineNo);
    bVar1 = isBlankLine((char *)in_stack_fffffffffffffe98);
    if (!bVar1) {
      std::__cxx11::string::push_back((char)local_88);
      local_a4 = 0;
      while( true ) {
        bVar1 = false;
        if ((local_90[local_a4] != '\0') && (bVar1 = false, local_90[local_a4] != '\n')) {
          bVar1 = local_90[local_a4] != '\r';
        }
        if (!bVar1) break;
        local_a4 = local_a4 + 1;
        std::__cxx11::string::push_back((char)local_88);
      }
    }
    if (local_98 != (char *)0x0) {
      std::__cxx11::string::push_back((char)local_88);
      local_a8 = 0;
      while( true ) {
        bVar1 = false;
        if ((local_98[local_a8] != '\0') && (bVar1 = false, local_98[local_a8] != '\n')) {
          bVar1 = local_98[local_a8] != '\r';
        }
        if (!bVar1) break;
        local_a8 = local_a8 + 1;
        std::__cxx11::string::push_back((char)local_88);
      }
      std::__cxx11::string::push_back((char)local_88);
      local_a8 = 0;
      drawUnderliner(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
    bVar1 = isBlankLine((char *)in_stack_fffffffffffffe98);
    if (!bVar1) {
      std::__cxx11::string::push_back((char)local_88);
      local_ac = 0;
      while( true ) {
        bVar1 = false;
        if ((local_a0[local_ac] != '\0') && (bVar1 = false, local_a0[local_ac] != '\n')) {
          bVar1 = local_a0[local_ac] != '\r';
        }
        if (!bVar1) break;
        local_ac = local_ac + 1;
        std::__cxx11::string::push_back((char)local_88);
      }
    }
    local_b8 = 0;
    if (((local_90 != (char *)0x0) || (local_98 != (char *)0x0)) || (local_a0 != (char *)0x0)) {
      std::__cxx11::string::push_back((char)local_88);
      std::__cxx11::string::push_back((char)local_88);
      local_b8 = std::__cxx11::string::c_str();
    }
    local_c0 = *(code **)(*(long *)(in_RDI[1] + 0x128) + 0x160);
    local_c8 = (SQSharedState *)std::__cxx11::string::c_str();
    local_d0 = *(code **)(*(long *)(in_RDI[1] + 0x128) + 0x178);
    if (local_d0 != (code *)0x0) {
      local_108[0] = *(undefined4 *)(local_30 + 0x10);
      local_100 = *(undefined8 *)(local_30 + 0x18);
      local_f8 = local_10;
      local_f4 = local_14;
      local_f0 = local_18;
      local_e0 = *in_RDI;
      local_d8 = local_31 & 1;
      local_e8 = local_c8;
      (*local_d0)(in_RDI[1],local_108);
    }
    if (((*(byte *)(in_RDI + 0x1e) & 1) != 0) && (local_c0 != (code *)0x0)) {
      local_10c = 2;
      if (*(int *)(local_30 + 8) == 0) {
        local_10c = 0;
      }
      else if (*(int *)(local_30 + 8) == 1) {
        local_10c = 1;
      }
      (*local_c0)(in_RDI[1],local_10c,local_c8,*in_RDI,(long)local_10,(long)local_14,local_b8);
    }
    if ((local_31 & 1) != 0) {
      x = *(SQString **)(in_RDI[1] + 0x128);
      ss = local_c8;
      std::__cxx11::string::length();
      SQString::Create(ss,(SQChar *)x,CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0))
      ;
      ::SQObjectPtr::operator=((SQObjectPtr *)ss,x);
      local_21 = 1;
    }
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_58);
  }
  if ((local_21 & 1) == 0) {
    return;
  }
  longjmp((__jmp_buf_tag *)(in_RDI + 4),1);
}

Assistant:

void SQCompilationContext::vreportDiagnostic(enum DiagnosticsId diagId, int32_t line, int32_t pos, int32_t width, va_list vargs) {
  assert(diagId < DI_NUM_OF_DIAGNOSTICS);

  bool doJump = false;

  if (!isDisabled(diagId, line, pos)) {

    auto &desc = diagnosticDescriptors[diagId];
    bool isError = desc.severity >= DS_ERROR;
    std::string message;

    vrenderDiagnosticHeader(diagId, message, vargs);

    std::string extraInfo;

    const char *l1 = findLine(line - 1);
    const char *l2 = findLine(line);
    const char *l3 = findLine(line + 1);

    if (!isBlankLine(l1)) {
      extraInfo.push_back('\n');
      int32_t j = 0;
      while (l1[j] && l1[j] != '\n' && l1[j] != '\r') { //-V522
        extraInfo.push_back(l1[j++]); //-V595
      }
    }

    if (l2 != nullptr) {
      extraInfo.push_back('\n');
      int32_t j = 0;
      while (l2[j] && l2[j] != '\n' && l2[j] != '\r') { //-V522
        extraInfo.push_back(l2[j++]); //-V595
      }

      extraInfo.push_back('\n');
      j = 0;

      drawUnderliner(pos, width, extraInfo);
    }

    if (!isBlankLine(l3)) {
      extraInfo.push_back('\n');
      int32_t j = 0;
      while (l3[j] && l3[j] != '\n' && l3[j] != '\r') { //-V522
        extraInfo.push_back(l3[j++]); //-V595
      }
    }

    const char *extra = nullptr;
    if (l1 || l2 || l3) {
      extraInfo.push_back('\n');
      extraInfo.push_back('\n'); // separate with extra line
      extra = extraInfo.c_str();
    }

    auto messageFunc = _ss(_vm)->_compilererrorhandler;

    const char *msg = message.c_str();

    auto diagMsgFunc = _ss(_vm)->_compilerdiaghandler;
    if (diagMsgFunc) {
      SQCompilerMessage cm;
      cm.intId = desc.id;
      cm.textId = desc.textId;
      cm.line = line;
      cm.column = pos;
      cm.columnsWidth = width;
      cm.message = msg;
      cm.fileName = _sourceName;
      cm.isError = isError;
      diagMsgFunc(_vm, &cm);
    }

    if (_raiseError && messageFunc) {
      SQMessageSeverity sev = SEV_ERROR;
      if (desc.severity == DS_HINT) sev = SEV_HINT;
      else if (desc.severity == DS_WARNING) sev = SEV_WARNING;
      messageFunc(_vm, sev, msg, _sourceName, line, pos, extra);
    }
    if (isError) {
      _vm->_lasterror = SQString::Create(_ss(_vm), msg, message.length());
      doJump = true;
    }
  }
  if (doJump)
    longjmp(_errorjmp, 1);
}